

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

MQTT_CLIENT_HANDLE
mqtt_client_init(ON_MQTT_MESSAGE_RECV_CALLBACK msgRecv,ON_MQTT_OPERATION_CALLBACK operation_cb,
                void *opCallbackCtx,ON_MQTT_ERROR_CALLBACK onErrorCallBack,void *errorCBCtx)

{
  LOGGER_LOG p_Var1;
  MQTT_CLIENT_HANDLE callbackCtx;
  TICK_COUNTER_HANDLE pTVar2;
  MQTTCODEC_HANDLE pMVar3;
  
  if (msgRecv == (ON_MQTT_MESSAGE_RECV_CALLBACK)0x0 ||
      operation_cb == (ON_MQTT_OPERATION_CALLBACK)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"mqtt_client_init",0x40b,1,
                "Invalid parameter specified msgRecv: %p, operation_cb: %p",msgRecv,operation_cb);
      return (MQTT_CLIENT_HANDLE)0x0;
    }
  }
  else {
    callbackCtx = (MQTT_CLIENT_HANDLE)calloc(1,0xb8);
    if (callbackCtx == (MQTT_CLIENT_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"mqtt_client_init",0x414,1,"mqtt_client_init failure: Allocation Failure");
        return (MQTT_CLIENT_HANDLE)0x0;
      }
    }
    else {
      callbackCtx->packetState = UNKNOWN_TYPE;
      callbackCtx->fnOperationCallback = operation_cb;
      callbackCtx->ctx = opCallbackCtx;
      callbackCtx->fnMessageRecv = msgRecv;
      callbackCtx->fnOnErrorCallBack = onErrorCallBack;
      callbackCtx->errorCBCtx = errorCBCtx;
      pTVar2 = tickcounter_create();
      callbackCtx->packetTickCntr = pTVar2;
      callbackCtx->maxPingRespTime = 0x50;
      if (pTVar2 == (TICK_COUNTER_HANDLE)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                    ,"mqtt_client_init",0x426,1,
                    "mqtt_client_init failure: tickcounter_create failure");
        }
      }
      else {
        pMVar3 = mqtt_codec_create(recvCompleteCallback,callbackCtx);
        callbackCtx->codec_handle = pMVar3;
        if (pMVar3 != (MQTTCODEC_HANDLE)0x0) {
          return callbackCtx;
        }
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                    ,"mqtt_client_init",0x430,1,
                    "mqtt_client_init failure: mqtt_codec_create failure");
        }
        tickcounter_destroy(callbackCtx->packetTickCntr);
      }
      free(callbackCtx);
    }
  }
  return (MQTT_CLIENT_HANDLE)0x0;
}

Assistant:

MQTT_CLIENT_HANDLE mqtt_client_init(ON_MQTT_MESSAGE_RECV_CALLBACK msgRecv, ON_MQTT_OPERATION_CALLBACK operation_cb, void* opCallbackCtx, ON_MQTT_ERROR_CALLBACK onErrorCallBack, void* errorCBCtx)
{
    MQTT_CLIENT* result;
    /*Codes_SRS_MQTT_CLIENT_07_001: [If the parameters ON_MQTT_MESSAGE_RECV_CALLBACK is NULL then mqttclient_init shall return NULL.]*/
    if (msgRecv == NULL || operation_cb == NULL)
    {
        LogError("Invalid parameter specified msgRecv: %p, operation_cb: %p", msgRecv, operation_cb);
        result = NULL;
    }
    else
    {
        result = malloc(sizeof(MQTT_CLIENT));
        if (result == NULL)
        {
            /*Codes_SRS_MQTT_CLIENT_07_002: [If any failure is encountered then mqttclient_init shall return NULL.]*/
            LogError("mqtt_client_init failure: Allocation Failure");
        }
        else
        {
            memset(result, 0, sizeof(MQTT_CLIENT));
            /*Codes_SRS_MQTT_CLIENT_07_003: [mqttclient_init shall allocate MQTTCLIENT_DATA_INSTANCE and return the MQTTCLIENT_HANDLE on success.]*/
            result->packetState = UNKNOWN_TYPE;
            result->fnOperationCallback = operation_cb;
            result->ctx = opCallbackCtx;
            result->fnMessageRecv = msgRecv;
            result->fnOnErrorCallBack = onErrorCallBack;
            result->errorCBCtx = errorCBCtx;
            result->qosValue = DELIVER_AT_MOST_ONCE;
            result->packetTickCntr = tickcounter_create();
            result->maxPingRespTime = DEFAULT_MAX_PING_RESPONSE_TIME;
            if (result->packetTickCntr == NULL)
            {
                /*Codes_SRS_MQTT_CLIENT_07_002: [If any failure is encountered then mqttclient_init shall return NULL.]*/
                LogError("mqtt_client_init failure: tickcounter_create failure");
                free(result);
                result = NULL;
            }
            else
            {
                result->codec_handle = mqtt_codec_create(recvCompleteCallback, result);
                if (result->codec_handle == NULL)
                {
                    /*Codes_SRS_MQTT_CLIENT_07_002: [If any failure is encountered then mqttclient_init shall return NULL.]*/
                    LogError("mqtt_client_init failure: mqtt_codec_create failure");
                    tickcounter_destroy(result->packetTickCntr);
                    free(result);
                    result = NULL;
                }
            }
        }
    }
    return result;
}